

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O2

int cuddGa(DdManager *table,int lower,int upper)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  st__table *table_00;
  void *pvVar6;
  void *__ptr;
  double *__ptr_00;
  ulong uVar7;
  long lVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  char *value;
  bool bVar22;
  int index;
  int local_58;
  int local_54;
  double local_50;
  int local_44;
  ulong local_40;
  int *pointer;
  
  iVar2 = cuddSifting(table,lower,upper);
  if (iVar2 == 0) {
    return 0;
  }
  numvars = (upper - lower) + 1;
  uVar15 = 0x78;
  if (numvars * 3 < 0x78) {
    uVar15 = numvars * 3;
  }
  if (table->populationSize != 0) {
    uVar15 = table->populationSize;
  }
  uVar19 = 4;
  if (4 < (int)uVar15) {
    uVar19 = uVar15;
  }
  popsize = uVar19;
  piVar4 = (int *)malloc((long)(int)(((upper - lower) + 2) * (uVar19 + 2)) << 2);
  storedd = piVar4;
  if (piVar4 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  piVar5 = (int *)malloc((ulong)uVar19 * 4);
  repeat = piVar5;
  if (piVar5 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    free(piVar4);
    storedd = (int *)0x0;
    return 0;
  }
  for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
    piVar5[uVar7] = 0;
  }
  table_00 = st__init_table(array_compare,array_hash);
  piVar4 = storedd;
  computed = table_00;
  if (table_00 == (st__table *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    iVar2 = 0;
LAB_006190d1:
    if (repeat == (int *)0x0) {
      return iVar2;
    }
    free(repeat);
    repeat = (int *)0x0;
    return iVar2;
  }
  lVar8 = (long)numvars;
  lVar21 = (long)lower;
  uVar7 = 0;
  uVar17 = 0;
  if (0 < numvars) {
    uVar17 = (ulong)(uint)numvars;
  }
  for (; uVar17 != uVar7; uVar7 = uVar7 + 1) {
    piVar4[uVar7] = table->invperm[lVar21 + uVar7];
  }
  piVar4[lVar8] = table->keys - table->isolated;
  uVar7 = 0;
  local_58 = lower;
  iVar2 = st__insert(table_00,(char *)piVar4,(char *)0x0);
  piVar4 = repeat;
  if (iVar2 == -10000) {
LAB_00619057:
    if (storedd != (int *)0x0) {
      free(storedd);
      storedd = (int *)0x0;
    }
    piVar4 = repeat;
    if (repeat == (int *)0x0) goto LAB_006192df;
  }
  else {
    *repeat = *repeat + 1;
    piVar5 = storedd;
    uVar15 = numvars;
    lVar8 = (long)numvars;
    iVar2 = numvars * 2;
    if (0 < numvars) {
      uVar7 = (ulong)(uint)numvars;
    }
    while (bVar22 = uVar7 != 0, uVar7 = uVar7 - 1, bVar22) {
      piVar5[iVar2] = table->invperm[lVar21];
      lVar21 = lVar21 + 1;
      iVar2 = iVar2 + -1;
    }
    local_54 = upper;
    pvVar6 = malloc(lVar8 << 2);
    iVar2 = local_54;
    if (pvVar6 != (void *)0x0) {
      for (iVar13 = 2; uVar19 = popsize, iVar13 < popsize; iVar13 = iVar13 + 1) {
        uVar7 = 0;
        if (0 < (int)uVar15) {
          uVar7 = (ulong)uVar15;
        }
        for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
          *(undefined4 *)((long)pvVar6 + uVar17 * 4) = 0;
        }
        for (iVar18 = 0; iVar18 < (int)uVar15; iVar18 = iVar18 + 1) {
          do {
            iVar3 = rand_int(numvars + -1);
          } while (*(int *)((long)pvVar6 + (long)iVar3 * 4) != 0);
          *(undefined4 *)((long)pvVar6 + (long)iVar3 * 4) = 1;
          uVar15 = numvars;
          storedd[(numvars + 1) * iVar13 + iVar18] = table->invperm[iVar3 + local_58];
        }
      }
      free(pvVar6);
      iVar13 = local_58;
      lVar8 = 4;
      for (value = (char *)0x1; dVar9 = (double)(ulong)uVar19, (long)value < (long)(int)uVar19;
          value = value + 1) {
        iVar3 = (int)value;
        iVar18 = build_dd(table,iVar3,iVar13,iVar2);
        if (iVar18 == 0) goto LAB_00619057;
        iVar18 = st__lookup_int(computed,(char *)(storedd + (long)iVar3 * ((long)numvars + 1)),
                                &index);
        if (iVar18 == 0) {
          iVar18 = st__insert(computed,(char *)(storedd + (long)iVar3 * ((long)numvars + 1)),value);
          if (iVar18 == -10000) goto LAB_00619057;
          piVar4 = (int *)((long)repeat + lVar8);
        }
        else {
          piVar4 = repeat + index;
        }
        *piVar4 = *piVar4 + 1;
        lVar8 = lVar8 + 4;
        uVar19 = popsize;
      }
      find_best();
      cross = table->numberXovers;
      if (table->numberXovers == 0) {
        cross = 0x3c;
        if (numvars * 3 < 0x3c) {
          cross = numvars * 3;
        }
      }
      iVar18 = 0;
      while (iVar18 < cross) {
        local_40 = (ulong)table->size;
        __size = local_40 * 4;
        pvVar6 = malloc(__size);
        if (pvVar6 == (void *)0x0) {
LAB_00619851:
          table->errorCode = CUDD_MEMORY_OUT;
          goto LAB_00619057;
        }
        local_44 = iVar18;
        __ptr = malloc(__size);
        if (__ptr == (void *)0x0) {
LAB_00619849:
          free(pvVar6);
          goto LAB_00619851;
        }
        __ptr_00 = (double *)malloc((long)SUB84(dVar9,0) * 8);
        piVar4 = storedd;
        iVar2 = numvars;
        if (__ptr_00 == (double *)0x0) {
          free(pvVar6);
          pvVar6 = __ptr;
          goto LAB_00619849;
        }
        lVar21 = (long)numvars;
        *__ptr_00 = 1.0 / (double)storedd[lVar21];
        piVar4 = piVar4 + lVar21 + (iVar2 + 1);
        for (lVar8 = 1; lVar8 < SUB84(dVar9,0); lVar8 = lVar8 + 1) {
          __ptr_00[lVar8] = 1.0 / (double)*piVar4 + __ptr_00[lVar8 + -1];
          piVar4 = piVar4 + (iVar2 + 1);
        }
        local_50 = __ptr_00[lVar21 + -1];
        lVar8 = Cudd_Random();
        uVar7 = 0;
        if (0 < popsize) {
          uVar7 = (ulong)(uint)popsize;
        }
        for (uVar17 = 0; uVar7 != uVar17; uVar17 = uVar17 + 1) {
          if (((double)lVar8 * local_50) / 2147483561.0 <= __ptr_00[uVar17]) {
            uVar7 = uVar17 & 0xffffffff;
            break;
          }
        }
        do {
          local_50 = __ptr_00[(long)popsize + -1];
          lVar8 = Cudd_Random();
          uVar17 = 0;
          if (0 < popsize) {
            uVar17 = (ulong)(uint)popsize;
          }
          for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
            if (((double)lVar8 * local_50) / 2147483561.0 <= __ptr_00[uVar10]) {
              uVar17 = uVar10 & 0xffffffff;
              break;
            }
          }
        } while ((int)uVar17 == (int)uVar7);
        free(__ptr_00);
        iVar2 = rand_int(numvars + -1);
        do {
          iVar13 = rand_int(numvars + -1);
        } while (iVar2 == iVar13);
        uVar10 = local_40 & 0xffffffff;
        if ((int)local_40 < 1) {
          uVar10 = 0;
        }
        for (uVar11 = 0; piVar4 = storedd, uVar10 != uVar11; uVar11 = uVar11 + 1) {
          *(undefined4 *)((long)pvVar6 + uVar11 * 4) = 0xffffffff;
          *(undefined4 *)((long)__ptr + uVar11 * 4) = 0xffffffff;
        }
        iVar18 = numvars + 1;
        iVar20 = (int)uVar17 * iVar18;
        local_50 = (double)(ulong)(uint)popsize;
        iVar16 = popsize * iVar18;
        iVar14 = (int)uVar7 * iVar18;
        iVar18 = (popsize + 1) * iVar18;
        iVar12 = numvars + -1;
        iVar3 = iVar2;
        while (iVar3 != iVar13) {
          iVar1 = piVar4[iVar3 + iVar20];
          piVar4[iVar3 + iVar16] = iVar1;
          *(int *)((long)pvVar6 + (long)iVar1 * 4) = iVar3;
          iVar1 = piVar4[iVar3 + iVar14];
          piVar4[iVar3 + iVar18] = iVar1;
          *(int *)((long)__ptr + (long)iVar1 * 4) = iVar3;
          bVar22 = iVar3 == iVar12;
          iVar3 = iVar3 + 1;
          if (bVar22) {
            iVar3 = 0;
          }
        }
        while (iVar3 = iVar13, iVar13 != iVar2) {
          do {
            iVar1 = piVar4[iVar3 + iVar14];
            iVar3 = *(int *)((long)pvVar6 + (long)iVar1 * 4);
          } while (iVar3 != -1);
          piVar4[iVar13 + iVar16] = iVar1;
          *(int *)((long)pvVar6 + (long)iVar1 * 4) = iVar13;
          iVar3 = iVar13;
          do {
            iVar1 = piVar4[iVar3 + iVar20];
            iVar3 = *(int *)((long)__ptr + (long)iVar1 * 4);
          } while (iVar3 != -1);
          piVar4[iVar13 + iVar18] = iVar1;
          *(int *)((long)__ptr + (long)iVar1 * 4) = iVar13;
          bVar22 = iVar13 == iVar12;
          iVar13 = iVar13 + 1;
          if (bVar22) {
            iVar13 = 0;
          }
        }
        free(pvVar6);
        free(__ptr);
        uVar7 = (ulong)local_50 & 0xffffffff;
        dVar9 = local_50;
        iVar2 = local_54;
        iVar13 = local_58;
        while (iVar18 = (int)uVar7, iVar18 <= SUB84(dVar9,0) + 1) {
          iVar3 = build_dd(table,iVar18,iVar13,iVar2);
          iVar2 = local_54;
          iVar13 = local_58;
          if (iVar3 == 0) goto LAB_00619057;
          uVar7 = 0xffffffffffffffff;
          do {
            lVar8 = uVar7 + 1;
            uVar7 = uVar7 + 1;
          } while (1 < repeat[lVar8]);
          iVar3 = numvars + 1;
          uVar17 = uVar7 & 0xffffffff;
LAB_00619655:
          large = (int)uVar17;
          iVar12 = large * iVar3 + numvars;
          piVar4 = (int *)((long)storedd + (uVar7 + 1) * (long)iVar3 * 4 + (long)numvars * 4);
LAB_0061966e:
          uVar7 = uVar7 + 1;
          if ((long)uVar7 < (long)popsize) goto code_r0x00619676;
          if (storedd[iVar12] <= storedd[iVar3 * iVar18 + numvars]) goto LAB_006197c7;
          iVar3 = st__lookup_int(computed,(char *)(storedd + large * iVar3),&index);
          piVar4 = repeat;
          if (iVar3 == 0) goto LAB_00619057;
          repeat[index] = repeat[index] + -1;
          if (piVar4[index] == 0) {
            pointer = storedd + ((long)numvars + 1) * (long)index;
            iVar3 = st__delete(computed,(char **)&pointer,(char **)0x0);
            if (iVar3 == 0) goto LAB_00619057;
          }
          piVar5 = storedd;
          lVar8 = (long)numvars;
          iVar3 = numvars + 1;
          piVar4 = storedd + iVar3 * large;
          for (lVar21 = 0; lVar21 <= lVar8; lVar21 = lVar21 + 1) {
            piVar4[lVar21] = piVar5[iVar18 * iVar3 + lVar21];
          }
          piVar5 = &index;
          iVar3 = st__lookup_int(computed,(char *)piVar4,piVar5);
          if (iVar3 == 0) {
            iVar3 = st__insert(computed,(char *)(storedd + ((long)numvars + 1) * (long)large),
                               (char *)(long)large);
            piVar5 = &large;
            if (iVar3 != -10000) goto LAB_006197ba;
            goto LAB_00619057;
          }
LAB_006197ba:
          repeat[*piVar5] = repeat[*piVar5] + 1;
LAB_006197c7:
          dVar9 = (double)(ulong)(uint)popsize;
          uVar7 = (ulong)(iVar18 + 1);
        }
        iVar18 = local_44 + 1;
      }
      iVar18 = find_best();
      st__free_table(computed);
      computed = (st__table *)0x0;
      iVar2 = build_dd(table,iVar18,iVar13,iVar2);
      if (storedd != (int *)0x0) {
        free(storedd);
        storedd = (int *)0x0;
      }
      goto LAB_006190d1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      storedd = (int *)0x0;
    }
  }
  free(piVar4);
  repeat = (int *)0x0;
LAB_006192df:
  st__free_table(computed);
  return 0;
code_r0x00619676:
  iVar14 = *piVar4;
  piVar4 = piVar4 + iVar3;
  if (storedd[iVar12] <= iVar14) goto code_r0x00619683;
  goto LAB_0061966e;
code_r0x00619683:
  if (repeat[uVar7] < 2) {
    uVar17 = uVar7 & 0xffffffff;
  }
  goto LAB_00619655;
}

Assistant:

int
cuddGa(
  DdManager * table /* manager */,
  int  lower /* lowest level to be reordered */,
  int  upper /* highest level to be reorderded */)
{
    int         i,n,m;          /* dummy/loop vars */
    int         index;
#ifdef DD_STATS
    double      average_fitness;
#endif
    int         small;          /* index of smallest DD in population */

    /* Do an initial sifting to produce at least one reasonable individual. */
    if (!cuddSifting(table,lower,upper)) return(0);

    /* Get the initial values. */
    numvars = upper - lower + 1; /* number of variables to be reordered */
    if (table->populationSize == 0) {
        popsize = 3 * numvars;  /* population size is 3 times # of vars */
        if (popsize > 120) {
            popsize = 120;      /* Maximum population size is 120 */
        }
    } else {
        popsize = table->populationSize;  /* user specified value */
    }
    if (popsize < 4) popsize = 4;       /* enforce minimum population size */

    /* Allocate population table. */
    storedd = ABC_ALLOC(int,(popsize+2)*(numvars+1));
    if (storedd == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    /* Initialize the computed table. This table is made up of two data
    ** structures: A hash table with the key given by the order, which says
    ** if a given order is present in the population; and the repeat
    ** vector, which says how many copies of a given order are stored in
    ** the population table. If there are multiple copies of an order, only
    ** one has a repeat count greater than 1. This copy is the one pointed
    ** by the computed table.
    */
    repeat = ABC_ALLOC(int,popsize);
    if (repeat == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        return(0);
    }
    for (i = 0; i < popsize; i++) {
        repeat[i] = 0;
    }
    computed = st__init_table(array_compare,array_hash);
    if (computed == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        return(0);
    }

    /* Copy the current DD and its size to the population table. */
    for (i = 0; i < numvars; i++) {
        STOREDD(0,i) = table->invperm[i+lower]; /* order of initial DD */
    }
    STOREDD(0,numvars) = table->keys - table->isolated; /* size of initial DD */

    /* Store the initial order in the computed table. */
    if ( st__insert(computed,(char *)storedd,(char *) 0) == st__OUT_OF_MEM) {
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    repeat[0]++;

    /* Insert the reverse order as second element of the population. */
    for (i = 0; i < numvars; i++) {
        STOREDD(1,numvars-1-i) = table->invperm[i+lower]; /* reverse order */
    }

    /* Now create the random orders. make_random fills the population
    ** table with random permutations. The successive loop builds and sifts
    ** the DDs for the reverse order and each random permutation, and stores
    ** the results in the computed table.
    */
    if (!make_random(table,lower)) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(storedd);
        ABC_FREE(repeat);
        st__free_table(computed);
        return(0);
    }
    for (i = 1; i < popsize; i++) {
        result = build_dd(table,i,lower,upper); /* build and sift order */
        if (!result) {
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        if ( st__lookup_int(computed,(char *)&STOREDD(i,0),&index)) {
            repeat[index]++;
        } else {
            if ( st__insert(computed,(char *)&STOREDD(i,0),(char *)(long)i) ==
            st__OUT_OF_MEM) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            repeat[i]++;
        }
    }

#if 0
#ifdef DD_STATS
    /* Print the initial population. */
    (void) fprintf(table->out,"Initial population after sifting\n");
    for (m = 0; m < popsize; m++) {
        for (i = 0; i < numvars; i++) {
            (void) fprintf(table->out," %2d",STOREDD(m,i));
        }
        (void) fprintf(table->out," : %3d (%d)\n",
                       STOREDD(m,numvars),repeat[m]);
    }
#endif
#endif

    small = find_best();
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nInitial population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Decide how many crossovers should be tried. */
    if (table->numberXovers == 0) {
        cross = 3*numvars;
        if (cross > 60) {       /* do a maximum of 50 crossovers */
            cross = 60;
        }
    } else {
        cross = table->numberXovers;      /* use user specified value */
    }

    /* Perform the crossovers to get the best order. */
    for (m = 0; m < cross; m++) {
        if (!PMX(table->size)) {        /* perform one crossover */
            table->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(storedd);
            ABC_FREE(repeat);
            st__free_table(computed);
            return(0);
        }
        /* The offsprings are left in the last two entries of the
        ** population table. These are now considered in turn.
        */
        for (i = popsize; i <= popsize+1; i++) {
            result = build_dd(table,i,lower,upper); /* build and sift child */
            if (!result) {
                ABC_FREE(storedd);
                ABC_FREE(repeat);
                st__free_table(computed);
                return(0);
            }
            large = largest();  /* find the largest DD in population */

            /* If the new child is smaller than the largest DD in the current
            ** population, enter it into the population in place of the
            ** largest DD.
            */
            if (STOREDD(i,numvars) < STOREDD(large,numvars)) {
                /* Look up the largest DD in the computed table.
                ** Decrease its repetition count. If the repetition count
                ** goes to 0, remove the largest DD from the computed table.
                */
                result = st__lookup_int(computed,(char *)&STOREDD(large,0),
                                       &index);
                if (!result) {
                    ABC_FREE(storedd);
                    ABC_FREE(repeat);
                    st__free_table(computed);
                    return(0);
                }
                repeat[index]--;
                if (repeat[index] == 0) {
                    int *pointer = &STOREDD(index,0);
                    result = st__delete(computed, (const char **)&pointer, NULL);
                    if (!result) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                }
                /* Copy the new individual to the entry of the
                ** population table just made available and update the
                ** computed table.
                */
                for (n = 0; n <= numvars; n++) {
                    STOREDD(large,n) = STOREDD(i,n);
                }
                if ( st__lookup_int(computed,(char *)&STOREDD(large,0),
                                  &index)) {
                    repeat[index]++;
                } else {
                    if ( st__insert(computed,(char *)&STOREDD(large,0),
                    (char *)(long)large) == st__OUT_OF_MEM) {
                        ABC_FREE(storedd);
                        ABC_FREE(repeat);
                        st__free_table(computed);
                        return(0);
                    }
                    repeat[large]++;
                }
            }
        }
    }

    /* Find the smallest DD in the population and build it;
    ** that will be the result.
    */
    small = find_best();

    /* Print stats on the final population. */
#ifdef DD_STATS
    average_fitness = find_average_fitness();
    (void) fprintf(table->out,"\nFinal population: best fitness = %d, average fitness %8.3f",STOREDD(small,numvars),average_fitness);
#endif

    /* Clean up, build the result DD, and return. */
    st__free_table(computed);
    computed = NULL;
    result = build_dd(table,small,lower,upper);
    ABC_FREE(storedd);
    ABC_FREE(repeat);
    return(result);

}